

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_VariableNode *
getArgumentsVariableNode(UA_Server *server,UA_MethodNode *ofMethod,UA_String withBrowseName)

{
  ulong uVar1;
  UA_ReferenceNode *pUVar2;
  UA_Boolean UVar3;
  UA_VariableNode *pUVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  undefined1 local_60 [8];
  UA_NodeId hasProperty;
  UA_String withBrowseName_local;
  
  hasProperty.identifier.string.data = (UA_Byte *)withBrowseName.length;
  local_60._0_2_ = 0;
  stack0xffffffffffffffa4 = 0x2e00000000;
  uVar1 = ofMethod->referencesSize;
  lVar6 = 0x20;
  uVar5 = 0;
  while( true ) {
    if (uVar1 <= uVar5) {
      return (UA_VariableNode *)0x0;
    }
    pUVar2 = ofMethod->references;
    if ((((*(char *)((long)pUVar2 + lVar6 + -8) == '\0') &&
         (UVar3 = UA_NodeId_equal((UA_NodeId *)local_60,(UA_NodeId *)((long)pUVar2 + lVar6 + -0x20))
         , UVar3)) &&
        (pUVar4 = (UA_VariableNode *)
                  UA_NodeStore_get(server->nodestore,
                                   (UA_NodeId *)
                                   ((long)&(pUVar2->referenceTypeId).namespaceIndex + lVar6)),
        pUVar4 != (UA_VariableNode *)0x0)) &&
       (((pUVar4->nodeClass == UA_NODECLASS_VARIABLE && ((pUVar4->browseName).namespaceIndex == 0))
        && (UVar3 = UA_String_equal((UA_String *)((long)&hasProperty.identifier + 8),
                                    &(pUVar4->browseName).name), UVar3)))) break;
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x50;
  }
  return pUVar4;
}

Assistant:

static const UA_VariableNode *
getArgumentsVariableNode(UA_Server *server, const UA_MethodNode *ofMethod,
                         UA_String withBrowseName) {
    UA_NodeId hasProperty = UA_NODEID_NUMERIC(0, UA_NS0ID_HASPROPERTY);
    for(size_t i = 0; i < ofMethod->referencesSize; ++i) {
        if(ofMethod->references[i].isInverse == false &&
            UA_NodeId_equal(&hasProperty, &ofMethod->references[i].referenceTypeId)) {
            const UA_Node *refTarget =
                UA_NodeStore_get(server->nodestore, &ofMethod->references[i].targetId.nodeId);
            if(!refTarget)
                continue;
            if(refTarget->nodeClass == UA_NODECLASS_VARIABLE &&
                refTarget->browseName.namespaceIndex == 0 &&
                UA_String_equal(&withBrowseName, &refTarget->browseName.name)) {
                return (const UA_VariableNode*) refTarget;
            }
        }
    }
    return NULL;
}